

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadBlifAig.c
# Opt level: O1

Abc_Obj_t * Io_BlifParseConstruct_rec(Io_BlifMan_t *p,char *pName)

{
  byte bVar1;
  Io_BlifObj_t *pIVar2;
  uint uVar3;
  uint uVar4;
  Io_BlifObj_t **ppIVar5;
  Vec_Ptr_t *vTokens;
  void **ppvVar6;
  Abc_Obj_t *pAVar7;
  size_t sVar8;
  Vec_Ptr_t *pVVar9;
  Abc_Obj_t *pAVar10;
  int iVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  Abc_Obj_t *p1;
  ulong uVar15;
  char *pcVar16;
  char *pcVar17;
  char *__format;
  Abc_Aig_t *pMan;
  long lVar18;
  long lVar19;
  void *pvVar20;
  uint local_3c;
  
  ppIVar5 = Io_BlifHashLookup(p,pName);
  pIVar2 = *ppIVar5;
  if (pIVar2 == (Io_BlifObj_t *)0x0) {
    uVar12 = (ulong)p->vLines->nSize;
    uVar14 = 0xffffffff;
    if (0 < (long)uVar12) {
      uVar15 = 0;
      do {
        if (pName < p->vLines->pArray[uVar15]) {
          uVar14 = uVar15 & 0xffffffff;
          break;
        }
        uVar15 = uVar15 + 1;
      } while (uVar12 != uVar15);
    }
    pcVar16 = "Line %d: Signal (%s) is not defined as a table.";
LAB_002cd269:
    sprintf(p->sError,pcVar16,uVar14,pName);
    return (Abc_Obj_t *)0x0;
  }
  uVar4 = *(uint *)pIVar2;
  if ((uVar4 & 0x20) != 0) {
    uVar12 = (ulong)p->vLines->nSize;
    uVar14 = 0xffffffff;
    if (0 < (long)uVar12) {
      uVar15 = 0;
      do {
        if (pName < p->vLines->pArray[uVar15]) {
          uVar14 = uVar15 & 0xffffffff;
          break;
        }
        uVar15 = uVar15 + 1;
      } while (uVar12 != uVar15);
    }
    pcVar16 = "Line %d: Signal (%s) appears twice on a combinational path.";
    goto LAB_002cd269;
  }
  if ((Abc_Obj_t *)pIVar2->pEquiv != (Abc_Obj_t *)0x0) {
    return (Abc_Obj_t *)pIVar2->pEquiv;
  }
  *(uint *)pIVar2 = uVar4 | 0x20;
  vTokens = (Vec_Ptr_t *)malloc(0x10);
  vTokens->nCap = 8;
  vTokens->nSize = 0;
  ppvVar6 = (void **)malloc(0x40);
  vTokens->pArray = ppvVar6;
  Io_BlifCollectTokens(vTokens,pIVar2->pName + -(ulong)(uVar4 >> 8),pIVar2->pName);
  iVar11 = vTokens->nSize;
  if (0 < (long)iVar11) {
    ppvVar6 = vTokens->pArray;
    lVar18 = 0;
    do {
      pAVar7 = Io_BlifParseConstruct_rec(p,(char *)ppvVar6[lVar18]);
      if (pAVar7 == (Abc_Obj_t *)0x0) {
        if (ppvVar6 != (void **)0x0) {
          free(ppvVar6);
          vTokens->pArray = (void **)0x0;
        }
        free(vTokens);
        return (Abc_Obj_t *)0x0;
      }
      ppvVar6[lVar18] = pAVar7;
      lVar18 = lVar18 + 1;
    } while (iVar11 != lVar18);
  }
  pcVar16 = pIVar2->pName;
  sVar8 = strlen(pcVar16);
  p->nTablesRead = p->nTablesRead + 1;
  Io_BlifSplitIntoTokens(p->vTokens,pcVar16 + sVar8,'.');
  pVVar9 = p->vTokens;
  uVar4 = pVVar9->nSize;
  if (uVar4 == 1) {
    pcVar16 = (char *)*pVVar9->pArray;
    if (((*pcVar16 - 0x30U & 0x8e) != 0) || (pcVar16[1] != '\0')) {
      uVar12 = (ulong)p->vLines->nSize;
      uVar14 = 0xffffffff;
      if (0 < (long)uVar12) {
        uVar15 = 0;
        do {
          if (pcVar16 < p->vLines->pArray[uVar15]) {
            uVar14 = uVar15 & 0xffffffff;
            break;
          }
          uVar15 = uVar15 + 1;
        } while (uVar12 != uVar15);
      }
      pcVar17 = "Line %d: Constant table has wrong output value (%s).";
      goto LAB_002cd4e3;
    }
    pAVar10 = Abc_AigConst1(p->pAig);
    pAVar7 = (Abc_Obj_t *)(ulong)(*pcVar16 == '0');
  }
  else {
    if (uVar4 == 0) {
      pAVar7 = Abc_AigConst1(p->pAig);
      pvVar20 = (void *)((ulong)pAVar7 ^ 1);
      goto LAB_002cd574;
    }
    if ((int)uVar4 < 1) {
LAB_002cd67a:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                    ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
    }
    if ((uVar4 & 1) != 0) {
      uVar14 = (ulong)p->vLines->nSize;
      uVar12 = 0xffffffff;
      if (0 < (long)uVar14) {
        uVar15 = 0;
        do {
          if (*pVVar9->pArray < p->vLines->pArray[uVar15]) {
            uVar12 = uVar15 & 0xffffffff;
            break;
          }
          uVar15 = uVar15 + 1;
        } while (uVar14 != uVar15);
      }
      pvVar20 = (void *)0x0;
      sprintf(p->sError,"Line %d: Table has odd number of tokens (%d).",uVar12);
      goto LAB_002cd574;
    }
    pAVar7 = Abc_AigConst1(p->pAig);
    pAVar7 = (Abc_Obj_t *)((ulong)pAVar7 ^ 1);
    pVVar9 = p->vTokens;
    iVar11 = pVVar9->nSize;
    if (1 < iVar11) {
      local_3c = 0xffffffff;
      lVar18 = 0;
LAB_002cd343:
      if (((long)iVar11 <= lVar18 * 2) || (uVar12 = lVar18 * 2 | 1, (long)iVar11 <= (long)uVar12))
      goto LAB_002cd67a;
      pcVar17 = (char *)pVVar9->pArray[lVar18 * 2];
      pcVar16 = (char *)pVVar9->pArray[uVar12];
      sVar8 = strlen(pcVar17);
      uVar12 = (ulong)(uint)vTokens->nSize;
      if (sVar8 == uVar12) {
        uVar4 = (int)*pcVar16 - 0x30;
        if (((uVar4 & 0x8e) == 0) && (pcVar16[1] == '\0')) {
          uVar3 = uVar4;
          if ((local_3c == 0xffffffff) || (uVar3 = local_3c, local_3c == uVar4)) {
            local_3c = uVar3;
            pAVar10 = Abc_AigConst1(p->pAig);
            lVar19 = 0;
            do {
              bVar1 = pcVar17[lVar19];
              if (bVar1 < 0x30) {
                if (bVar1 != 0x2d) goto LAB_002cd441;
              }
              else {
                if (bVar1 == 0x31) {
                  if (vTokens->nSize <= lVar19) goto LAB_002cd67a;
                  pMan = (Abc_Aig_t *)p->pAig->pManFunc;
                  p1 = (Abc_Obj_t *)vTokens->pArray[lVar19];
                }
                else {
                  if (bVar1 != 0x30) goto LAB_002cd4f3;
                  if (vTokens->nSize <= lVar19) goto LAB_002cd67a;
                  pMan = (Abc_Aig_t *)p->pAig->pManFunc;
                  p1 = (Abc_Obj_t *)((ulong)vTokens->pArray[lVar19] ^ 1);
                }
                pAVar10 = Abc_AigAnd(pMan,pAVar10,p1);
              }
              lVar19 = lVar19 + 1;
            } while( true );
          }
          uVar12 = (ulong)p->vLines->nSize;
          uVar15 = 0xffffffff;
          if ((long)uVar12 < 1) goto LAB_002cd660;
          uVar14 = 0;
          goto LAB_002cd637;
        }
        uVar12 = (ulong)p->vLines->nSize;
        uVar14 = 0xffffffff;
        if ((long)uVar12 < 1) goto LAB_002cd603;
        uVar15 = 0;
        goto LAB_002cd5c2;
      }
      uVar14 = (ulong)p->vLines->nSize;
      uVar15 = 0xffffffff;
      if ((long)uVar14 < 1) goto LAB_002cd649;
      uVar13 = 0;
      goto LAB_002cd5f1;
    }
    pAVar10 = (Abc_Obj_t *)0x0;
  }
  goto LAB_002cd556;
LAB_002cd441:
  if (bVar1 != 0) {
LAB_002cd4f3:
    uVar12 = (ulong)(uint)(int)(char)bVar1;
    uVar14 = (ulong)p->vLines->nSize;
    uVar15 = 0xffffffff;
    if ((long)uVar14 < 1) goto LAB_002cd55d;
    uVar13 = 0;
    goto LAB_002cd516;
  }
  pAVar7 = Abc_AigOr((Abc_Aig_t *)p->pAig->pManFunc,pAVar7,pAVar10);
  lVar18 = lVar18 + 1;
  pVVar9 = p->vTokens;
  iVar11 = pVVar9->nSize;
  if (iVar11 / 2 <= lVar18) goto code_r0x002cd48c;
  goto LAB_002cd343;
code_r0x002cd48c:
  pAVar10 = (Abc_Obj_t *)(ulong)(local_3c == 0);
LAB_002cd556:
  pvVar20 = (void *)((ulong)pAVar7 ^ (ulong)pAVar10);
  goto LAB_002cd574;
  while (uVar13 = uVar13 + 1, uVar14 != uVar13) {
LAB_002cd516:
    if (pcVar17 < p->vLines->pArray[uVar13]) {
      uVar15 = uVar13 & 0xffffffff;
      break;
    }
  }
LAB_002cd55d:
  __format = "Line %d: Product term (%s) contains character (%c).";
  goto LAB_002cd56d;
  while (uVar14 = uVar14 + 1, uVar12 != uVar14) {
LAB_002cd637:
    if (pcVar17 < p->vLines->pArray[uVar14]) {
      uVar15 = uVar14 & 0xffffffff;
      break;
    }
  }
LAB_002cd660:
  __format = 
  "Line %d: Output value (%s) differs from the value in the first line of the table (%d).";
  uVar12 = (ulong)local_3c;
  pcVar17 = pcVar16;
  goto LAB_002cd56d;
  while (uVar15 = uVar15 + 1, uVar12 != uVar15) {
LAB_002cd5c2:
    if (pcVar17 < p->vLines->pArray[uVar15]) {
      uVar14 = uVar15 & 0xffffffff;
      break;
    }
  }
LAB_002cd603:
  pcVar17 = "Line %d: Output value (%s) is incorrect.";
LAB_002cd4e3:
  pvVar20 = (void *)0x0;
  sprintf(p->sError,pcVar17,uVar14,pcVar16);
  goto LAB_002cd574;
  while (uVar13 = uVar13 + 1, uVar14 != uVar13) {
LAB_002cd5f1:
    if (pcVar17 < p->vLines->pArray[uVar13]) {
      uVar15 = uVar13 & 0xffffffff;
      break;
    }
  }
LAB_002cd649:
  __format = "Line %d: Cube (%s) has size different from the fanin count (%d).";
LAB_002cd56d:
  pvVar20 = (void *)0x0;
  sprintf(p->sError,__format,uVar15,pcVar17,uVar12);
LAB_002cd574:
  pIVar2->pEquiv = pvVar20;
  if (vTokens->pArray != (void **)0x0) {
    free(vTokens->pArray);
    vTokens->pArray = (void **)0x0;
  }
  free(vTokens);
  *(byte *)pIVar2 = *(byte *)pIVar2 & 0xdf;
  return (Abc_Obj_t *)pIVar2->pEquiv;
}

Assistant:

static Abc_Obj_t * Io_BlifParseConstruct_rec( Io_BlifMan_t * p, char * pName )
{
    Vec_Ptr_t * vFanins;
    Abc_Obj_t * pFaninAbc;
    Io_BlifObj_t * pObjIo;
    char * pNameFanin;
    int i;
    // get the IO object with this name
    pObjIo = *Io_BlifHashLookup( p, pName );
    if ( pObjIo == NULL )
    {
        sprintf( p->sError, "Line %d: Signal (%s) is not defined as a table.", Io_BlifGetLine(p, pName), pName );
        return NULL;
    }
    // loop detection
    if ( pObjIo->fLoop )
    {
        sprintf( p->sError, "Line %d: Signal (%s) appears twice on a combinational path.", Io_BlifGetLine(p, pName), pName );
        return NULL;
    }
    // check if the AIG is already constructed
    if ( pObjIo->pEquiv )
        return (Abc_Obj_t *)pObjIo->pEquiv;
    // mark this node on the path
    pObjIo->fLoop = 1;
    // construct the AIGs for the fanins
    vFanins = Vec_PtrAlloc( 8 );
    Io_BlifCollectTokens( vFanins, pObjIo->pName - pObjIo->Offset, pObjIo->pName );
    Vec_PtrForEachEntry( char *, vFanins, pNameFanin, i )
    {
        pFaninAbc = Io_BlifParseConstruct_rec( p, pNameFanin );
        if ( pFaninAbc == NULL )
        {
            Vec_PtrFree( vFanins );
            return NULL;
        }
        Vec_PtrWriteEntry( vFanins, i, pFaninAbc );
    }
    // construct the node
    pObjIo->pEquiv = Io_BlifParseTable( p, pObjIo->pName + strlen(pObjIo->pName), vFanins );
    Vec_PtrFree( vFanins );
    // unmark this node on the path
    pObjIo->fLoop = 0;
    // remember the new node
    return (Abc_Obj_t *)pObjIo->pEquiv;
}